

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbdstrmatrix.cpp
# Opt level: O1

TPZStructMatrix * __thiscall
TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::Clone
          (TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  *(undefined ***)this_00 = &PTR__TPZSavable_0198f278;
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                              super_TPZStructMatrix + -0x60);
  *(undefined8 *)(this_00 + 1) = 0x198f110;
  *(undefined8 *)this_00 = 0x198f1d8;
  *(undefined4 *)&this_00[1].fMesh =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1);
  *(undefined1 *)((long)&this_00[1].fMesh + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__0198ea18,(TPZStructMatrix *)this);
  *(undefined8 *)this_00 = 0x198e7d0;
  *(undefined8 *)(this_00 + 1) = 0x198e998;
  *(undefined8 *)&this_00->field_0xa0 = 0x198e898;
  *(undefined8 *)&this_00->field_0xa8 =
       *(undefined8 *)
        &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.field_0xa8;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBlockDiagonalStructMatrix<TVar,TPar>::Clone(){
    return new TPZBlockDiagonalStructMatrix(*this);
}